

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O2

void __thiscall diy::AMRLink::Description::Description(Description *this)

{
  initializer_list<int> lst;
  int local_1c;
  
  this->level = -1;
  local_1c = 0;
  lst._M_len = 1;
  lst._M_array = &local_1c;
  DynamicPoint<int,_4UL>::DynamicPoint(&this->refinement,lst);
  Bounds<int>::Bounds(&this->core,0);
  Bounds<int>::Bounds(&this->bounds,0);
  return;
}

Assistant:

Description() = default;